

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::TaggerImpl::set_lattice_level(TaggerImpl *this,int level)

{
  int level_local;
  TaggerImpl *this_local;
  
  if (level == 0) {
    this->request_type_ = this->request_type_ | 1;
  }
  else if (level == 1) {
    this->request_type_ = this->request_type_ | 2;
  }
  else if (level == 2) {
    this->request_type_ = this->request_type_ | 8;
  }
  return;
}

Assistant:

void TaggerImpl::set_lattice_level(int level) {
  switch (level) {
    case 0: request_type_ |= MECAB_ONE_BEST;
      break;
    case 1: request_type_ |= MECAB_NBEST;
      break;
    case 2: request_type_ |= MECAB_MARGINAL_PROB;
      break;
    default:
      break;
  }
}